

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xform.cc
# Opt level: O3

vector3d * tinyusdz::transform(vector3d *__return_storage_ptr__,matrix4d *m,vector3d *p)

{
  double dVar1;
  double dVar2;
  double dVar3;
  size_t j;
  long lVar4;
  long lVar5;
  Ty value;
  double dVar6;
  
  dVar2 = m->m[3][0];
  dVar3 = m->m[3][1];
  dVar1 = m->m[3][2];
  lVar4 = 0;
  do {
    dVar6 = 0.0;
    lVar5 = 0;
    do {
      dVar6 = dVar6 + *(double *)((long)m + lVar5 * 4) * *(double *)((long)&p->x + lVar5);
      lVar5 = lVar5 + 8;
    } while (lVar5 != 0x18);
    (&__return_storage_ptr__->x)[lVar4] = dVar6;
    lVar4 = lVar4 + 1;
    m = (matrix4d *)((long)m + 8);
  } while (lVar4 != 3);
  __return_storage_ptr__->x = dVar2 + __return_storage_ptr__->x;
  __return_storage_ptr__->y = dVar3 + __return_storage_ptr__->y;
  __return_storage_ptr__->z = dVar1 + __return_storage_ptr__->z;
  return __return_storage_ptr__;
}

Assistant:

value::vector3d transform(const value::matrix4d &m, const value::vector3d &p) {
  value::vector3d tx{m.m[3][0], m.m[3][1], m.m[3][2]};
  value::vector3d v =
      value::MultV<value::matrix4d, value::vector3d, double, double, 3>(m, p);
  v.x += tx.x;
  v.y += tx.y;
  v.z += tx.z;
  return v;
}